

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sketch_impl.h
# Opt level: O0

vector<unsigned_int,_std::allocator<unsigned_int>_> *
FindRoots<(anonymous_namespace)::Field<unsigned_int,32,141u,RecLinTrans<unsigned_int,6,6,5,5,5,5>,RecLinTrans<unsigned_int,4,4,4,4,4,4,4,4>,&(anonymous_namespace)::SQR_TABLE_32,&(anonymous_namespace)::QRT_TABLE_32>>
          (vector<unsigned_int,_std::allocator<unsigned_int>_> *poly,Elem basis,
          Field<unsigned_int,_32,_141U,_RecLinTrans<unsigned_int,_6,_6,_5,_5,_5,_5>,_RecLinTrans<unsigned_int,_4,_4,_4,_4,_4,_4,_4,_4>,_&(anonymous_namespace)::SQR_TABLE_32,_&(anonymous_namespace)::QRT_TABLE_32>
          *field)

{
  initializer_list<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> __l;
  bool bVar1;
  size_type sVar2;
  size_type sVar3;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_RCX;
  int in_EDX;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_RSI;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_RDI;
  long in_FS_OFFSET;
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  stack;
  vector<unsigned_int,_std::allocator<unsigned_int>_> roots;
  allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *in_stack_fffffffffffffed8;
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  *in_stack_fffffffffffffee8;
  allocator_type *in_stack_ffffffffffffff10;
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  *in_stack_ffffffffffffff18;
  undefined7 in_stack_ffffffffffffff20;
  undefined1 in_stack_ffffffffffffff27;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_stack_ffffffffffffff28;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_stack_ffffffffffffff30;
  long *plVar4;
  long *local_c8;
  int in_stack_ffffffffffffff90;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *pos;
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  *in_stack_ffffffffffffffa8;
  Elem in_stack_ffffffffffffffbc;
  Field<unsigned_int,_32,_141U,_RecLinTrans<unsigned_int,_6,_6,_5,_5,_5,_5>,_RecLinTrans<unsigned_int,_4,_4,_4,_4,_4,_4,_4,_4>,_&(anonymous_namespace)::SQR_TABLE_32,_&(anonymous_namespace)::QRT_TABLE_32>
  *in_stack_ffffffffffffffd0;
  long local_20 [3];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pos = in_RDI;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_stack_fffffffffffffed8);
  sVar2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                     in_stack_fffffffffffffed8);
  if (sVar2 == 0) {
    memset(in_RDI,0,0x18);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_stack_fffffffffffffed8);
  }
  else if (in_EDX == 0) {
    memset(in_RDI,0,0x18);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_stack_fffffffffffffed8);
  }
  else {
    sVar2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                      ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                       in_stack_fffffffffffffed8);
    if (sVar2 == 1) {
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_stack_fffffffffffffed8,
                 (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x1520195);
    }
    else {
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_stack_fffffffffffffed8);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::reserve
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_stack_ffffffffffffff18,
                 (size_type)in_stack_ffffffffffffff10);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                (in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
      std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::allocator
                (in_stack_fffffffffffffed8);
      __l._M_array._7_1_ = in_stack_ffffffffffffff27;
      __l._M_array._0_7_ = in_stack_ffffffffffffff20;
      __l._M_len = (size_type)in_stack_ffffffffffffff28;
      std::
      vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
      ::vector(in_stack_ffffffffffffff18,__l,in_stack_ffffffffffffff10);
      std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::~allocator
                (in_stack_fffffffffffffed8);
      plVar4 = local_20;
      local_c8 = &local_8;
      do {
        local_c8 = local_c8 + -3;
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
                  ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_stack_fffffffffffffee8)
        ;
      } while (local_c8 != plVar4);
      bVar1 = RecFindRoots<(anonymous_namespace)::Field<unsigned_int,32,141u,RecLinTrans<unsigned_int,6,6,5,5,5,5>,RecLinTrans<unsigned_int,4,4,4,4,4,4,4,4>,&(anonymous_namespace)::SQR_TABLE_32,&(anonymous_namespace)::QRT_TABLE_32>>
                        (in_stack_ffffffffffffffa8,(size_t)pos,in_RSI,SUB41((uint)in_EDX >> 0x18,0),
                         in_stack_ffffffffffffff90,in_stack_ffffffffffffffbc,
                         in_stack_ffffffffffffffd0);
      if (bVar1) {
        sVar2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(in_RCX);
        sVar3 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(in_RCX);
        if (sVar2 - 1 == sVar3) {
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                    (in_RCX,(vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x152047d);
        }
        else {
          memset(in_RDI,0,0x18);
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(in_RCX);
        }
      }
      else {
        memset(in_RDI,0,0x18);
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(in_RCX);
      }
      std::
      vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
      ::~vector(in_stack_fffffffffffffee8);
    }
  }
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_stack_fffffffffffffee8);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

std::vector<typename F::Elem> FindRoots(const std::vector<typename F::Elem>& poly, typename F::Elem basis, const F& field) {
    std::vector<typename F::Elem> roots;
    CHECK_RETURN(poly.size() != 0, {});
    CHECK_RETURN(basis != 0, {});
    if (poly.size() == 1) return roots; // No roots when the polynomial is a constant.
    roots.reserve(poly.size() - 1);
    std::vector<std::vector<typename F::Elem>> stack = {poly};

    // Invoke the recursive factorization algorithm.
    if (!RecFindRoots(stack, 0, roots, false, 0, basis, field)) {
        // Not fully factorizable.
        return {};
    }
    CHECK_RETURN(poly.size() - 1 == roots.size(), {});
    return roots;
}